

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextGLImpl::Begin(DeviceContextGLImpl *this,Uint32 ImmediateContextId)

{
  string msg;
  string local_28;
  
  FormatString<char[42]>(&local_28,(char (*) [42])"OpenGL does not support deferred contexts");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"Begin",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x54);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::Begin(Uint32 ImmediateContextId)
{
    UNEXPECTED("OpenGL does not support deferred contexts");
    (void)(ImmediateContextId);
}